

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL> SVar1;
  Storage *pSVar2;
  size_t sVar3;
  anon_class_8_1_8991fb9c in_RSI;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>_>
  *in_RDI;
  size_t num_destroyed;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>_>
  *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>_>
  *this_01;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>_>
  *in_stack_ffffffffffffffa0;
  anon_class_24_3_45a051ed in_stack_ffffffffffffffb0;
  StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL> local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>_>
  *local_10;
  
  local_18.storage = (Storage *)0x0;
  this_01 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>_>
             *)&stack0xffffffffffffffe8;
  this_00 = in_RDI;
  local_10 = in_RSI.this;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,slang::SourceLocation>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,slang::detail::hashing::StackAllocator<std::pair<slang::BufferID_const,slang::SourceLocation>,128ul,16ul>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,slang::SourceLocation>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,slang::detail::hashing::StackAllocator<std::pair<slang::BufferID_const,slang::SourceLocation>,128ul,16ul>>::unchecked_rehash(boost::unordered::detail::foa::table_arrays<std::pair<slang::BufferID_const,slang::SourceLocation>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy,slang::detail::hashing::StackAllocator<std::pair<slang::BufferID_const,slang::SourceLocation>,128ul,16ul>>&)::_lambda(std::pair<slang::BufferID_const,slang::SourceLocation>*)_1_>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0);
  SVar1.storage = local_18.storage;
  pSVar2 = (Storage *)size(in_RDI);
  if (SVar1.storage != pSVar2) {
    table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,slang::SourceLocation>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,slang::detail::hashing::StackAllocator<std::pair<slang::BufferID_const,slang::SourceLocation>,128ul,16ul>>
    ::
    for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,slang::SourceLocation>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,slang::detail::hashing::StackAllocator<std::pair<slang::BufferID_const,slang::SourceLocation>,128ul,16ul>>::unchecked_rehash(boost::unordered::detail::foa::table_arrays<std::pair<slang::BufferID_const,slang::SourceLocation>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy,slang::detail::hashing::StackAllocator<std::pair<slang::BufferID_const,slang::SourceLocation>,128ul,16ul>>&)::_lambda(std::pair<slang::BufferID_const,slang::SourceLocation>*)_3_>
              (this_00,in_RSI);
  }
  delete_arrays(in_RSI.this,(arrays_type *)this_00);
  (in_RDI->arrays).groups_size_index =
       (size_t)(local_10->
               super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_slang::SourceLocation>,_128UL,_16UL>,_2U,_false>
               ).value_.storage;
  (in_RDI->arrays).groups_size_mask = (local_10->arrays).groups_size_index;
  (in_RDI->arrays).groups_ = (group_type_pointer)(local_10->arrays).groups_size_mask;
  (in_RDI->arrays).elements_ = (value_type_pointer)(local_10->arrays).groups_;
  sVar3 = initial_max_load(this_01);
  (in_RDI->size_ctrl).ml = sVar3;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }